

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseXMLDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlParserInputPtr pxVar5;
  xmlParserErrors code;
  byte *pbVar6;
  ulong uVar7;
  xmlErrorLevel level;
  
  ctxt->standalone = -2;
  pxVar5 = ctxt->input;
  pxVar4 = pxVar5->cur;
  pxVar5->cur = pxVar4 + 5;
  pxVar5->col = pxVar5->col + 5;
  bVar2 = pxVar4[5];
  if (bVar2 == 0) {
    xmlParserGrow(ctxt);
    bVar2 = *ctxt->input->cur;
  }
  if ((0x20 < bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Blank needed after \'<?xml\'\n")
    ;
  }
  xmlSkipBlankChars(ctxt);
  pxVar4 = xmlParseVersionInfo(ctxt);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_VERSION_MISSING,(char *)0x0);
  }
  else {
    iVar3 = xmlStrEqual(pxVar4,"1.0");
    if (iVar3 == 0) {
      if ((((ctxt->options & 0x20000) == 0) && (*pxVar4 == '1')) && (pxVar4[1] == '.')) {
        code = XML_WAR_UNKNOWN_VERSION;
        level = XML_ERR_WARNING;
      }
      else {
        code = XML_ERR_UNKNOWN_VERSION;
        level = XML_ERR_FATAL;
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,level,pxVar4,(xmlChar *)0x0,
                 (xmlChar *)0x0,0,"Unsupported version \'%s\'\n",pxVar4);
    }
    if (ctxt->version != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->version);
    }
    ctxt->version = pxVar4;
  }
  pxVar5 = ctxt->input;
  pbVar6 = pxVar5->cur;
  uVar7 = (ulong)*pbVar6;
  if (uVar7 < 0x40) {
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((uVar7 == 0x3f) && (pbVar6[1] == 0x3e)) goto LAB_0013dd6e;
      goto LAB_0013dc53;
    }
  }
  else {
LAB_0013dc53:
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Blank needed here\n");
  }
  xmlParseEncodingDecl(ctxt);
  pxVar5 = ctxt->input;
  if (ctxt->encoding != (xmlChar *)0x0) {
    pbVar6 = pxVar5->cur;
    uVar7 = (ulong)*pbVar6;
    if (uVar7 < 0x40) {
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0013dd19;
      if ((uVar7 == 0x3f) && (pbVar6[1] == 0x3e)) goto LAB_0013dd6e;
    }
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Blank needed here\n");
    pxVar5 = ctxt->input;
  }
LAB_0013dd19:
  if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  iVar3 = xmlParseSDDecl(ctxt);
  ctxt->standalone = iVar3;
  xmlSkipBlankChars(ctxt);
  pxVar5 = ctxt->input;
  pbVar6 = pxVar5->cur;
  if (*pbVar6 == 0x3e) {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
    xmlNextChar(ctxt);
    return;
  }
  if ((*pbVar6 != 0x3f) || (pbVar6[1] != 0x3e)) {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
    while( true ) {
      if (1 < ctxt->disableSAX) {
        return;
      }
      xVar1 = *ctxt->input->cur;
      if (xVar1 == '\0') break;
      xmlNextChar(ctxt);
      if (xVar1 == '>') {
        return;
      }
    }
    return;
  }
LAB_0013dd6e:
  pxVar5->cur = pbVar6 + 2;
  pxVar5->col = pxVar5->col + 2;
  if (pbVar6[2] != 0) {
    return;
  }
  xmlParserGrow(ctxt);
  return;
}

Assistant:

void
xmlParseXMLDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;

    /*
     * This value for standalone indicates that the document has an
     * XML declaration but it does not have a standalone attribute.
     * It will be overwritten later if a standalone attribute is found.
     */

    ctxt->standalone = -2;

    /*
     * We know that '<?xml' is here.
     */
    SKIP(5);

    if (!IS_BLANK_CH(RAW)) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	               "Blank needed after '<?xml'\n");
    }
    SKIP_BLANKS;

    /*
     * We must have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL) {
	xmlFatalErr(ctxt, XML_ERR_VERSION_MISSING, NULL);
    } else {
	if (!xmlStrEqual(version, (const xmlChar *) XML_DEFAULT_VERSION)) {
	    /*
	     * Changed here for XML-1.0 5th edition
	     */
	    if (ctxt->options & XML_PARSE_OLD10) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
			          "Unsupported version '%s'\n",
			          version);
	    } else {
	        if ((version[0] == '1') && ((version[1] == '.'))) {
		    xmlWarningMsg(ctxt, XML_WAR_UNKNOWN_VERSION,
		                  "Unsupported version '%s'\n",
				  version, NULL);
		} else {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
				      "Unsupported version '%s'\n",
				      version);
		}
	    }
	}
	if (ctxt->version != NULL)
	    xmlFree((void *) ctxt->version);
	ctxt->version = version;
    }

    /*
     * We may have the encoding declaration
     */
    if (!IS_BLANK_CH(RAW)) {
        if ((RAW == '?') && (NXT(1) == '>')) {
	    SKIP(2);
	    return;
	}
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
    }
    xmlParseEncodingDecl(ctxt);

    /*
     * We may have the standalone status.
     */
    if ((ctxt->encoding != NULL) && (!IS_BLANK_CH(RAW))) {
        if ((RAW == '?') && (NXT(1) == '>')) {
	    SKIP(2);
	    return;
	}
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
    }

    /*
     * We can grow the input buffer freely at that point
     */
    GROW;

    SKIP_BLANKS;
    ctxt->standalone = xmlParseSDDecl(ctxt);

    SKIP_BLANKS;
    if ((RAW == '?') && (NXT(1) == '>')) {
        SKIP(2);
    } else if (RAW == '>') {
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
        int c;

	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
        while ((PARSER_STOPPED(ctxt) == 0) &&
               ((c = CUR) != 0)) {
            NEXT;
            if (c == '>')
                break;
        }
    }
}